

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
fmt::v9::detail::write_escaped_cp<fmt::v9::detail::counting_iterator,char>
          (counting_iterator out,find_escape_result<char> *escape)

{
  int iVar1;
  counting_iterator out_00;
  counting_iterator out_01;
  counting_iterator cVar2;
  type count;
  iterator pcVar3;
  iterator pcVar4;
  undefined8 *in_RSI;
  size_t in_RDI;
  char escape_char;
  iterator __end0;
  iterator __begin0;
  basic_string_view<char> *__range4;
  char c;
  counting_iterator *in_stack_ffffffffffffff28;
  char *s;
  counting_iterator local_c8;
  value_type local_b9;
  size_t local_b8;
  counting_iterator in_stack_ffffffffffffff50;
  char prefix;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined8 in_stack_ffffffffffffff60;
  counting_iterator in_stack_ffffffffffffff68;
  basic_string_view<char> local_90;
  basic_string_view<char> *local_80;
  counting_iterator local_58;
  value_type local_4b;
  char local_4a [2];
  counting_iterator local_48;
  value_type local_3b;
  char local_3a [2];
  counting_iterator local_38;
  value_type local_2b;
  char local_2a [2];
  counting_iterator local_28;
  value_type local_1b;
  char local_1a;
  char local_19 [9];
  size_t local_10;
  
  local_19[0] = *(char *)(in_RSI + 2);
  iVar1 = *(int *)(in_RSI + 2);
  local_10 = in_RDI;
  if (iVar1 == 9) {
    local_3a[0] = '\\';
    local_48 = counting_iterator::operator++(in_stack_ffffffffffffff28,0);
    counting_iterator::operator*(&local_48);
    counting_iterator::value_type::operator=(&local_3b,local_3a);
    local_19[0] = 't';
  }
  else if (iVar1 == 10) {
    local_1a = '\\';
    local_28 = counting_iterator::operator++(in_stack_ffffffffffffff28,0);
    counting_iterator::operator*(&local_28);
    counting_iterator::value_type::operator=(&local_1b,&local_1a);
    local_19[0] = 'n';
  }
  else if (iVar1 == 0xd) {
    local_2a[0] = '\\';
    local_38 = counting_iterator::operator++(in_stack_ffffffffffffff28,0);
    counting_iterator::operator*(&local_38);
    counting_iterator::value_type::operator=(&local_2b,local_2a);
    local_19[0] = 'r';
  }
  else {
    if (((iVar1 != 0x22) && (iVar1 != 0x27)) && (iVar1 != 0x5c)) {
      prefix = (char)(in_stack_ffffffffffffff50.count_ >> 0x38);
      if (*(uint *)(in_RSI + 2) < 0x100) {
        out_00.count_._7_1_ = in_stack_ffffffffffffff5f;
        out_00.count_._0_7_ = in_stack_ffffffffffffff58;
        cVar2 = write_codepoint<2ul,char,fmt::v9::detail::counting_iterator>
                          (out_00,prefix,(uint32_t)in_stack_ffffffffffffff50.count_);
        return (counting_iterator)cVar2.count_;
      }
      if (*(uint *)(in_RSI + 2) < 0x10000) {
        out_01.count_._7_1_ = in_stack_ffffffffffffff5f;
        out_01.count_._0_7_ = in_stack_ffffffffffffff58;
        cVar2 = write_codepoint<4ul,char,fmt::v9::detail::counting_iterator>
                          (out_01,prefix,(uint32_t)in_stack_ffffffffffffff50.count_);
        return (counting_iterator)cVar2.count_;
      }
      if (*(uint *)(in_RSI + 2) < 0x110000) {
        cVar2 = write_codepoint<8ul,char,fmt::v9::detail::counting_iterator>
                          (in_stack_ffffffffffffff68,
                           (char)((ulong)in_stack_ffffffffffffff60 >> 0x38),
                           (uint32_t)in_stack_ffffffffffffff60);
        return (counting_iterator)cVar2.count_;
      }
      s = (char *)*in_RSI;
      count = to_unsigned<long>(0x1de06e);
      basic_string_view<char>::basic_string_view(&local_90,s,count);
      local_80 = &local_90;
      pcVar3 = basic_string_view<char>::begin(local_80);
      pcVar4 = basic_string_view<char>::end(local_80);
      for (; pcVar3 != pcVar4; pcVar3 = pcVar3 + 1) {
        local_b8 = local_10;
        cVar2.count_._7_1_ = *pcVar3;
        cVar2.count_._0_7_ = in_stack_ffffffffffffff58;
        in_stack_ffffffffffffff50 =
             write_codepoint<2ul,char,fmt::v9::detail::counting_iterator>
                       (cVar2,(char)(in_stack_ffffffffffffff50.count_ >> 0x38),
                        (uint32_t)in_stack_ffffffffffffff50.count_);
        local_10 = in_stack_ffffffffffffff50.count_;
      }
      return (counting_iterator)local_10;
    }
    local_4a[0] = '\\';
    local_58 = counting_iterator::operator++(in_stack_ffffffffffffff28,0);
    counting_iterator::operator*(&local_58);
    counting_iterator::value_type::operator=(&local_4b,local_4a);
  }
  local_c8 = counting_iterator::operator++(in_stack_ffffffffffffff28,0);
  counting_iterator::operator*(&local_c8);
  counting_iterator::value_type::operator=(&local_b9,local_19);
  return (counting_iterator)local_10;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (is_utf8()) {
      if (escape.cp < 0x100) {
        return write_codepoint<2, Char>(out, 'x', escape.cp);
      }
      if (escape.cp < 0x10000) {
        return write_codepoint<4, Char>(out, 'u', escape.cp);
      }
      if (escape.cp < 0x110000) {
        return write_codepoint<8, Char>(out, 'U', escape.cp);
      }
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}